

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O2

int __thiscall iqnet::ssl::Connection::shutdown(Connection *this,int __fd,int __how)

{
  bool bVar1;
  undefined3 extraout_var;
  int ret;
  int extraout_EAX;
  int extraout_EAX_00;
  
  bVar1 = shutdown_recved(this);
  if (bVar1) {
    bVar1 = shutdown_sent(this);
    if (bVar1) {
      return CONCAT31(extraout_var,bVar1);
    }
  }
  ret = SSL_shutdown((SSL *)this->ssl);
  if (ret == 1) {
    return 1;
  }
  if (ret != 0) {
    throw_io_exception(this->ssl,ret);
    return extraout_EAX_00;
  }
  SSL_shutdown((SSL *)this->ssl);
  SSL_set_shutdown((SSL *)this->ssl,2);
  return extraout_EAX;
}

Assistant:

void ssl::Connection::shutdown()
{
  if( shutdown_recved() && shutdown_sent() )
    return;

  int ret = SSL_shutdown( ssl );
  switch( ret )
  {
    case 1:
      return;

    case 0:
      SSL_shutdown( ssl );
      SSL_set_shutdown( ssl, SSL_RECEIVED_SHUTDOWN );
      break;

    default:
      throw_io_exception( ssl, ret );
  }
}